

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdRetag.cpp
# Opt level: O0

int CmdRetag(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  size_t *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  reference this_00;
  string *psVar4;
  size_type sVar5;
  size_type sVar6;
  reference piVar7;
  string *__return_storage_ptr__;
  ostream *poVar8;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  reference local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Interval modified;
  Interval *interval_1;
  iterator __end1;
  iterator __begin1;
  vector<Interval,_std::allocator<Interval>_> *__range1;
  string local_2b8;
  reference local_298;
  Interval *interval;
  iterator __end4;
  iterator __begin4;
  vector<Interval,_std::allocator<Interval>_> *__range4;
  bool found;
  int *id;
  iterator __end3;
  iterator __begin3;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  set<int,_std::less<int>,_std::allocator<int>_> local_238;
  undefined1 local_208 [8];
  IntervalFilterAllWithIds filtering_1;
  undefined1 local_1b0 [8];
  vector<Interval,_std::allocator<Interval>_> latest;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  IntervalFilterFirstOf filtering;
  vector<Interval,_std::allocator<Interval>_> intervals;
  undefined1 local_c8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  Journal *pJStack_28;
  bool verbose;
  Journal *journal_local;
  Database *database_local;
  Rules *rules_local;
  CLI *cli_local;
  
  pJStack_28 = journal;
  journal_local = (Journal *)database;
  database_local = (Database *)rules;
  rules_local = (Rules *)cli;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"verbose",&local_51);
  bVar2 = Rules::getBoolean(rules,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar2;
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)
              &tags._M_t._M_impl.super__Rb_tree_header._M_node_count,(CLI *)rules_local);
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,(CLI *)rules_local);
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
  if (bVar2) {
    intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar4,"At least one tag must be specified. See \'timew help retag\'.",
               (allocator<char> *)
               ((long)&intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(pJStack_28);
  flattenDatabase((Database *)journal_local,(Rules *)database_local);
  std::vector<Interval,_std::allocator<Interval>_>::vector
            ((vector<Interval,_std::allocator<Interval>_> *)
             &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     &tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    latest.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Range::Range((Range *)&latest.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    std::make_shared<IntervalFilterAllInRange,Range>((Range *)local_128);
    std::shared_ptr<IntervalFilter>::shared_ptr<IntervalFilterAllInRange,void>
              ((shared_ptr<IntervalFilter> *)(local_128 + 0x10),
               (shared_ptr<IntervalFilterAllInRange> *)local_128);
    IntervalFilterFirstOf::IntervalFilterFirstOf
              ((IntervalFilterFirstOf *)local_108,(shared_ptr<IntervalFilter> *)(local_128 + 0x10));
    std::shared_ptr<IntervalFilter>::~shared_ptr((shared_ptr<IntervalFilter> *)(local_128 + 0x10));
    std::shared_ptr<IntervalFilterAllInRange>::~shared_ptr
              ((shared_ptr<IntervalFilterAllInRange> *)local_128);
    Range::~Range((Range *)&latest.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)local_1b0,(Database *)journal_local,
               (Rules *)database_local,(IntervalFilter *)local_108);
    bVar2 = std::vector<Interval,_std::allocator<Interval>_>::empty
                      ((vector<Interval,_std::allocator<Interval>_> *)local_1b0);
    if (bVar2) {
      filtering_1._id_end._M_node._6_1_ = 1;
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (psVar4,"There is no active time tracking.",
                 (allocator<char> *)((long)&filtering_1._id_end._M_node + 7));
      filtering_1._id_end._M_node._6_1_ = 0;
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    this_00 = std::vector<Interval,_std::allocator<Interval>_>::at
                        ((vector<Interval,_std::allocator<Interval>_> *)local_1b0,0);
    bVar2 = Range::is_open(&this_00->super_Range);
    if (!bVar2) {
      filtering_1._id_end._M_node._4_1_ = 1;
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (psVar4,"At least one ID must be specified. See \'timew help retag\'.",
                 (allocator<char> *)((long)&filtering_1._id_end._M_node + 5));
      filtering_1._id_end._M_node._4_1_ = 0;
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::vector<Interval,_std::allocator<Interval>_>::operator=
              ((vector<Interval,_std::allocator<Interval>_> *)
               &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(vector<Interval,_std::allocator<Interval>_> *)local_1b0);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_1b0);
    IntervalFilterFirstOf::~IntervalFilterFirstOf((IntervalFilterFirstOf *)local_108);
  }
  else {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              (&local_238,
               (set<int,_std::less<int>,_std::allocator<int>_> *)
               &tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    IntervalFilterAllWithIds::IntervalFilterAllWithIds
              ((IntervalFilterAllWithIds *)local_208,&local_238);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_238);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)&__range3,(Database *)journal_local,
               (Rules *)database_local,(IntervalFilter *)local_208);
    std::vector<Interval,_std::allocator<Interval>_>::operator=
              ((vector<Interval,_std::allocator<Interval>_> *)
               &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(vector<Interval,_std::allocator<Interval>_> *)&__range3);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)&__range3);
    sVar5 = std::vector<Interval,_std::allocator<Interval>_>::size
                      ((vector<Interval,_std::allocator<Interval>_> *)
                       &filtering._filter.
                        super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar5 != sVar6) {
      this = &tags._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end3 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
      id = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&id), bVar2) {
        piVar7 = std::_Rb_tree_const_iterator<int>::operator*(&__end3);
        bVar2 = false;
        p_Var1 = &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        __end4 = std::vector<Interval,_std::allocator<Interval>_>::begin
                           ((vector<Interval,_std::allocator<Interval>_> *)p_Var1);
        interval = (Interval *)
                   std::vector<Interval,_std::allocator<Interval>_>::end
                             ((vector<Interval,_std::allocator<Interval>_> *)p_Var1);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                           *)&interval), bVar3) {
          local_298 = __gnu_cxx::
                      __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                      ::operator*(&__end4);
          if (local_298->id == *piVar7) {
            bVar2 = true;
            break;
          }
          __gnu_cxx::
          __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
          operator++(&__end4);
        }
        if (!bVar2) {
          __range1._6_1_ = 1;
          __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,"ID \'@{1}\' does not correspond to any tracking.",
                     (allocator<char> *)((long)&__range1 + 7));
          format<int>(__return_storage_ptr__,&local_2b8,*piVar7);
          __range1._6_1_ = 0;
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        std::_Rb_tree_const_iterator<int>::operator++(&__end3);
      }
    }
    IntervalFilterAllWithIds::~IntervalFilterAllWithIds((IntervalFilterAllWithIds *)local_208);
  }
  p_Var1 = &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  __end1 = std::vector<Interval,_std::allocator<Interval>_>::begin
                     ((vector<Interval,_std::allocator<Interval>_> *)p_Var1);
  interval_1 = (Interval *)
               std::vector<Interval,_std::allocator<Interval>_>::end
                         ((vector<Interval,_std::allocator<Interval>_> *)p_Var1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                     *)&interval_1), bVar2) {
    modified._tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
                 operator*(&__end1);
    Interval::Interval((Interval *)&__range2,
                       (Interval *)modified._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Interval::clearTags((Interval *)&__range2);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c8);
    tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&tag), bVar2) {
      local_3c0 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
      Interval::tag((Interval *)&__range2,local_3c0);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    Database::modifyInterval
              ((Database *)journal_local,
               (Interval *)modified._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Interval *)&__range2,(bool)(local_29 & 1));
    if ((local_29 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Retagged @");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,*(int *)(modified._tags._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 0x68));
      poVar8 = std::operator<<(poVar8," as ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_400," ",&local_401);
      joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&local_3e0,&local_400,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8);
      poVar8 = std::operator<<(poVar8,(string *)&local_3e0);
      std::operator<<(poVar8,'\n');
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator(&local_401);
    }
    Interval::~Interval((Interval *)&__range2);
    __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
    operator++(&__end1);
  }
  Journal::endTransaction(pJStack_28);
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)
             &filtering._filter.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_c8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return 0;
}

Assistant:

int CmdRetag (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  std::set <int> ids = cli.getIds ();
  std::set <std::string> tags = cli.getTags ();

  if (tags.empty ())
  {
    throw std::string ("At least one tag must be specified. See 'timew help retag'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  std::vector <Interval> intervals;

  if (ids.empty ())
  {
    IntervalFilterFirstOf filtering {std::make_shared <IntervalFilterAllInRange> (Range {})};
    auto latest = getTracked (database, rules, filtering);

    if (latest.empty ())
    {
      throw std::string ("There is no active time tracking.");
    }
    else if (! latest.at (0).is_open ())
    {
      throw std::string ("At least one ID must be specified. See 'timew help retag'.");
    }

    intervals = latest;
  }
  else
  {
    auto filtering = IntervalFilterAllWithIds (ids);
    intervals = getTracked (database, rules, filtering);

    if (intervals.size () != ids.size ())
    {
      for (auto& id: ids)
      {
        bool found = false;

        for (auto& interval: intervals)
        {
          if (interval.id == id)
          {
            found = true;
            break;
          }
        }
        if (! found)
        {
          throw format ("ID '@{1}' does not correspond to any tracking.", id);
        }
      }
    }
  }

  // Remove old tags and apply new tags to intervals.
  for (const auto& interval : intervals)
  {
    Interval modified {interval};

    modified.clearTags ();

    for (auto& tag : tags)
    {
      modified.tag (tag);
    }

    database.modifyInterval (interval, modified, verbose);

    if (verbose)
    {
      std::cout << "Retagged @" << interval.id << " as " << joinQuotedIfNeeded (" ", tags) << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}